

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int replace_bytes(uchar *bytes,size_t bytes_len,uchar **bytes_out,size_t *bytes_len_out)

{
  _Bool _Var1;
  int iVar2;
  uchar *new_bytes;
  
  new_bytes = (uchar *)0x0;
  iVar2 = -2;
  if (((bytes != (uchar *)0x0) != (bytes_len == 0)) &&
     ((*bytes_out != (uchar *)0x0) != (*bytes_len_out == 0))) {
    _Var1 = clone_data(&new_bytes,bytes,bytes_len);
    if (_Var1) {
      clear_and_free(*bytes_out,*bytes_len_out);
      *bytes_out = new_bytes;
      *bytes_len_out = bytes_len;
      iVar2 = 0;
    }
    else {
      iVar2 = -3;
    }
  }
  return iVar2;
}

Assistant:

int replace_bytes(const unsigned char *bytes, size_t bytes_len,
                  unsigned char **bytes_out, size_t *bytes_len_out)
{
    unsigned char *new_bytes = NULL;

    if (BYTES_INVALID(bytes, bytes_len) || BYTES_INVALID(*bytes_out, *bytes_len_out))
        return WALLY_EINVAL;

    /* TODO: Avoid reallocation if new bytes is smaller than the existing one */
    if (!clone_bytes(&new_bytes, bytes, bytes_len))
        return WALLY_ENOMEM;

    clear_and_free(*bytes_out, *bytes_len_out);
    *bytes_out = new_bytes;
    *bytes_len_out = bytes_len;
    return WALLY_OK;
}